

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O0

void __thiscall tst_future::then(tst_future *this)

{
  bool bVar1;
  QString local_b8;
  bool local_9a;
  bool local_99;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> *local_98;
  QPromiseBase<QString> local_90;
  QPromiseBase<void> local_80;
  bool local_6a;
  bool local_69 [6];
  bool local_63;
  bool local_62 [2];
  undefined1 local_60 [8];
  Promise output;
  int local_3c;
  undefined1 local_38 [8];
  Type input;
  QString result;
  tst_future *this_local;
  
  QString::QString((QString *)&input.super_QPromiseBase<int>.m_d);
  local_3c = 0x2a;
  QtPromise::resolve<int>((QtPromise *)local_38,&local_3c);
  QtPromise::QPromiseBase<int>::then<tst_future::then()::__0>
            ((QPromiseBase<int> *)local_60,(anon_class_1_0_00000001 *)local_38);
  local_62[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_38);
  local_63 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (local_62,&local_63,"input.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0xe7);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_69[0] = QtPromise::QPromiseBase<QString>::isPending((QPromiseBase<QString> *)local_60);
    local_6a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_69,&local_6a,"output.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0xe8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_98 = &input.super_QPromiseBase<int>.m_d;
      QtPromise::QPromiseBase<QString>::then<tst_future::then()::__1>
                (&local_90,(anon_class_8_1_6971b95b *)local_60);
      QtPromise::QPromiseBase<void>::wait(&local_80,&local_90);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_80);
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&local_90);
      local_99 = QtPromise::QPromiseBase<QString>::isFulfilled((QPromiseBase<QString> *)local_60);
      local_9a = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_99,&local_9a,"output.isFulfilled()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0xf0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        QString::QString(&local_b8,"foo42");
        bVar1 = QTest::qCompare((QString *)&input.super_QPromiseBase<int>.m_d,&local_b8,"result",
                                "QString{\"foo42\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                                ,0xf1);
        QString::~QString(&local_b8);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_69[1] = false;
          local_69[2] = false;
          local_69[3] = false;
          local_69[4] = false;
        }
        else {
          local_69[1] = true;
          local_69[2] = false;
          local_69[3] = false;
          local_69[4] = false;
        }
      }
      else {
        local_69[1] = true;
        local_69[2] = false;
        local_69[3] = false;
        local_69[4] = false;
      }
    }
    else {
      local_69[1] = true;
      local_69[2] = false;
      local_69[3] = false;
      local_69[4] = false;
    }
  }
  else {
    local_69[1] = true;
    local_69[2] = false;
    local_69[3] = false;
    local_69[4] = false;
  }
  QtPromise::QPromise<QString>::~QPromise((QPromise<QString> *)local_60);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QString::~QString((QString *)&input.super_QPromiseBase<int>.m_d);
  return;
}

Assistant:

void tst_future::then()
{
    QString result;
    auto input = QtPromise::resolve(42);
    auto output = input.then([](int res) {
        return QtConcurrent::run([=]() {
            return QString{"foo%1"}.arg(res);
        });
    });

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    output
        .then([&](const QString& res) {
            result = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(result, QString{"foo42"});
}